

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O0

int rtr_undo_update_pfx_table_batch
              (rtr_socket *rtr_socket,pfx_table *pfx_table,pdu_ipv4 *ipv4_pdus,size_t ipv4_pdu_count
              ,pdu_ipv6 *ipv6_pdus,size_t ipv6_pdu_count)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  ulong uStack_60;
  int res_1;
  size_t i_1;
  ulong uStack_50;
  int res;
  size_t i;
  size_t ipv6_pdu_count_local;
  pdu_ipv6 *ipv6_pdus_local;
  size_t ipv4_pdu_count_local;
  pdu_ipv4 *ipv4_pdus_local;
  pfx_table *pfx_table_local;
  rtr_socket *rtr_socket_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (uStack_50 = 0; uStack_50 < ipv4_pdu_count; uStack_50 = uStack_50 + 1) {
    iVar2 = rtr_undo_update_pfx_table(rtr_socket,pfx_table,ipv4_pdus + uStack_50);
    if ((iVar2 == -1) || (iVar2 == -1)) {
      lrtr_dbg(
              "RTR Socket: Couldn\'t undo all update operations from failed data synchronisation: Purging all prefix records"
              );
      pfx_table_src_remove(pfx_table,rtr_socket);
      rtr_socket_local._4_4_ = -1;
      goto LAB_00110c86;
    }
  }
  uStack_60 = 0;
  do {
    if (ipv6_pdu_count <= uStack_60) {
      rtr_socket_local._4_4_ = 0;
LAB_00110c86:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return rtr_socket_local._4_4_;
      }
      __stack_chk_fail();
    }
    iVar2 = rtr_undo_update_pfx_table(rtr_socket,pfx_table,ipv6_pdus + uStack_60);
    if ((iVar2 == -1) || (iVar2 == -1)) {
      lrtr_dbg(
              "RTR Socket: Couldn\'t undo all update operations from failed data synchronisation: Purging all prefix records"
              );
      pfx_table_src_remove(pfx_table,rtr_socket);
      rtr_socket_local._4_4_ = -1;
      goto LAB_00110c86;
    }
    uStack_60 = uStack_60 + 1;
  } while( true );
}

Assistant:

static int rtr_undo_update_pfx_table_batch(struct rtr_socket *rtr_socket, struct pfx_table *pfx_table,
					   struct pdu_ipv4 *ipv4_pdus, size_t ipv4_pdu_count,
					   struct pdu_ipv6 *ipv6_pdus, size_t ipv6_pdu_count)
{
	for (size_t i = 0; i < ipv4_pdu_count; i++) {
		int res = rtr_undo_update_pfx_table(rtr_socket, pfx_table, &(ipv4_pdus[i]));

		if (res == RTR_ERROR || res == PFX_ERROR) {
			// Undo failed, cannot recover, remove all records associated with the socket instead
			RTR_DBG1(
				"Couldn't undo all update operations from failed data synchronisation: Purging all prefix records");
			pfx_table_src_remove(pfx_table, rtr_socket);
			return RTR_ERROR;
		}
	}

	for (size_t i = 0; i < ipv6_pdu_count; i++) {
		int res = rtr_undo_update_pfx_table(rtr_socket, pfx_table, &(ipv6_pdus[i]));

		if (res == RTR_ERROR || res == PFX_ERROR) {
			// Undo failed, cannot recover, remove all records associated with the socket instead
			RTR_DBG1(
				"Couldn't undo all update operations from failed data synchronisation: Purging all prefix records");
			pfx_table_src_remove(pfx_table, rtr_socket);
			return RTR_ERROR;
		}
	}
	return RTR_SUCCESS;
}